

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1b0fcc::AbiTagAttr::printLeft(AbiTagAttr *this,OutputStream *S)

{
  char *__src;
  size_t N;
  
  (*this->Base->_vptr_Node[4])();
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"[abi:",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  __src = (this->Tag).First;
  N = (long)(this->Tag).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,__src,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ']';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Base->printLeft(S);
    S += "[abi:";
    S += Tag;
    S += "]";
  }